

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::JitAllocator::alloc(JitAllocator *this,Span *out,size_t size)

{
  JitAllocatorOptions JVar1;
  JitAllocatorPrivateImpl *impl;
  uint32_t areaSize;
  DualMapping mapping;
  Error EVar2;
  ulong uVar3;
  size_t sVar4;
  JitAllocatorBlock *this_00;
  int iVar5;
  long lVar6;
  uint32_t blockFlags;
  ulong uVar7;
  ulong uVar8;
  JitAllocatorBlock *pJVar9;
  JitAllocatorPool *pJVar10;
  uint uVar11;
  JitAllocatorBlock *pJVar12;
  JitAllocatorPool *pJVar13;
  ulong uVar14;
  bool bVar15;
  size_t rangeStart;
  unsigned_long *puStack_90;
  ulong local_88;
  JitAllocatorPool *local_80;
  ulong local_78;
  size_t rangeEnd;
  Span *local_68;
  pthread_mutex_t *local_60;
  JitAllocatorBlock *local_58;
  BitVectorRangeIterator<unsigned_long,_0U> it;
  
  out->_size = 0;
  out->_block = (void *)0x0;
  out->_flags = kNone;
  out->_reserved = 0;
  out->_rx = (void *)0x0;
  out->_rw = (void *)0x0;
  impl = (JitAllocatorPrivateImpl *)this->_impl;
  if (impl == (JitAllocatorPrivateImpl *)JitAllocatorImpl_none) {
    return 5;
  }
  uVar7 = (ulong)(impl->super_Impl).granularity;
  uVar7 = -uVar7 & (size + uVar7) - 1;
  if (uVar7 == 0) {
    return 2;
  }
  if (0x7fffffff < uVar7) {
    return 9;
  }
  local_60 = (pthread_mutex_t *)&impl->lock;
  local_68 = out;
  pthread_mutex_lock(local_60);
  lVar6 = impl->poolCount - 1;
  uVar3 = (ulong)(impl->super_Impl).granularity << ((byte)lVar6 & 0x3f);
  pJVar13 = impl->pools + impl->poolCount;
  while( true ) {
    pJVar10 = pJVar13 + -1;
    bVar15 = lVar6 == 0;
    lVar6 = lVar6 + -1;
    if ((bVar15) || ((-uVar3 & uVar3 + (uVar7 - 1)) == uVar7)) break;
    uVar3 = uVar3 >> 1;
    pJVar13 = pJVar10;
  }
  uVar3 = (uVar7 - 1) + (ulong)pJVar13[-1].granularity >> (pJVar13[-1].granularityLog2 & 0x3f);
  pJVar9 = *(JitAllocatorBlock **)pJVar10;
  local_88 = uVar7;
  local_80 = pJVar10;
  local_78 = uVar3;
  if (pJVar9 != (JitAllocatorBlock *)0x0) {
    uVar7 = uVar3 & 0xffffffff;
    this_00 = pJVar9;
    local_58 = pJVar9;
    do {
      pJVar12 = *(JitAllocatorBlock **)&this_00->field_0x18;
      if (pJVar12 == (JitAllocatorBlock *)0x0) {
        pJVar12 = *(JitAllocatorBlock **)pJVar10;
      }
      if (((uint)uVar3 <= this_00->_areaSize - this_00->_areaUsed) &&
         (((this_00->_flags & 4) != 0 || ((uint)uVar3 <= this_00->_largestUnusedArea)))) {
        BitVectorRangeIterator<unsigned_long,_0U>::init(&it,(EVP_PKEY_CTX *)this_00->_usedBitVector)
        ;
        rangeStart = 0;
        rangeEnd = (size_t)this_00->_areaSize;
        uVar8 = 0xffffffffffffffff;
        uVar14 = 0;
        while (bVar15 = BitVectorRangeIterator<unsigned_long,_0U>::nextRange
                                  (&it,&rangeStart,&rangeEnd,uVar7), bVar15) {
          uVar3 = rangeEnd - rangeStart;
          if (uVar7 <= uVar3) {
            if ((int)rangeStart != -1) {
              uVar11 = this_00->_flags;
              iVar5 = (int)local_78;
              uVar7 = rangeStart;
              pJVar13 = local_80;
              if ((uVar11 & 2) != 0) {
                local_80->emptyBlockCount = local_80->emptyBlockCount + 0xff;
                this_00->_flags = uVar11 & 0xfffffffd;
              }
              goto LAB_0011b463;
            }
            break;
          }
          if (rangeStart < uVar8) {
            uVar8 = rangeStart;
          }
          if (uVar14 <= uVar3) {
            uVar14 = uVar3;
          }
        }
        pJVar9 = local_58;
        uVar3 = local_78;
        pJVar10 = local_80;
        if (uVar8 != 0xffffffffffffffff) {
          this_00->_searchStart = (uint32_t)uVar8;
          this_00->_searchEnd = (uint32_t)rangeEnd;
          this_00->_largestUnusedArea = (uint32_t)uVar14;
          *(byte *)&this_00->_flags = (byte)this_00->_flags & 0xfb;
        }
      }
      this_00 = pJVar12;
    } while (pJVar12 != pJVar9);
  }
  if (*(long *)&pJVar10->field_0x8 == 0) {
    uVar7 = (ulong)(impl->super_Impl).blockSize;
  }
  else {
    uVar7 = *(ulong *)(*(long *)&pJVar10->field_0x8 + 0x38);
  }
  JVar1 = (impl->super_Impl).options;
  uVar3 = local_88;
  if ((JVar1 & kDisableInitialPadding) == kNone) {
    uVar3 = pJVar10->granularity + local_88;
  }
  uVar8 = uVar7 << (uVar7 < 0x4000000);
  EVar2 = 1;
  if (uVar8 < uVar3) {
    uVar7 = (ulong)(impl->super_Impl).blockSize;
    uVar8 = -uVar7 & (uVar3 + uVar7) - 1;
    if (uVar8 < uVar3) goto LAB_0011b4b0;
  }
  else if (uVar7 == 0) goto LAB_0011b4b0;
  rangeStart = 0;
  puStack_90 = (unsigned_long *)0x0;
  blockFlags = (uint32_t)((JVar1 & kDisableInitialPadding) == kNone);
  if ((JVar1 & kUseDualMapping) == kNone) {
    if ((JVar1 & kUseLargePages) == kNone) {
LAB_0011b312:
      EVar2 = VirtMem::alloc((void **)&rangeStart,uVar8,kAccessRWX);
      uVar7 = uVar8;
      if (EVar2 != 0) goto LAB_0011b4b0;
    }
    else {
      sVar4 = VirtMem::largePageSize();
      if (uVar8 < sVar4) {
        bVar15 = ((impl->super_Impl).options & kAlignBlockSizeToLargePage) == kNone;
      }
      else {
        bVar15 = false;
      }
      if ((sVar4 == 0) || (bVar15)) goto LAB_0011b312;
      uVar7 = -sVar4 & (sVar4 + uVar8) - 1;
      EVar2 = VirtMem::alloc((void **)&rangeStart,uVar7,kMMapLargePages|kAccessRWX);
      if (EVar2 != 0) goto LAB_0011b312;
      blockFlags = blockFlags | 8;
    }
    puStack_90 = (unsigned_long *)rangeStart;
    uVar8 = uVar7;
  }
  else {
    EVar2 = VirtMem::allocDualMapping((DualMapping *)&rangeStart,uVar8,kAccessRWX);
    if (EVar2 != 0) goto LAB_0011b4b0;
    blockFlags = blockFlags | 0x10;
  }
  areaSize = (uint32_t)((pJVar10->granularity + uVar8) - 1 >> (pJVar10->granularityLog2 & 0x3f));
  uVar11 = areaSize + 0x3f >> 6;
  this_00 = (JitAllocatorBlock *)malloc((ulong)(uVar11 << 4) + 0x68);
  JVar1 = (impl->super_Impl).options;
  if (this_00 == (JitAllocatorBlock *)0x0) {
    if ((JVar1 & kUseDualMapping) == kNone) {
      VirtMem::release((void *)rangeStart,uVar8);
    }
    else {
      VirtMem::releaseDualMapping((DualMapping *)&rangeStart,uVar8);
    }
    EVar2 = 1;
  }
  else {
    if ((JVar1 & kFillUnusedMemory) != kNone) {
      it._ptr = puStack_90;
      it._end._0_4_ = 0;
      it._idx = uVar8;
      VirtMem::protectJitMemory(kReadWrite);
      JitAllocatorImpl_fillPattern(puStack_90,(impl->super_Impl).fillPattern,uVar8);
      VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope((ProtectJitReadWriteScope *)&it);
    }
    pJVar13 = local_80;
    mapping.rw = puStack_90;
    mapping.rx = (void *)rangeStart;
    JitAllocatorBlock::JitAllocatorBlock
              (this_00,local_80,mapping,uVar8,blockFlags,(BitWord *)(this_00 + 1),
               (BitWord *)
               (&this_00[1].super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
               (ulong)uVar11 * 8),areaSize);
    uVar11 = this_00->_flags;
    JitAllocatorImpl_insertBlock(impl,this_00);
    iVar5 = (int)local_78;
    this_00->_searchStart = this_00->_searchStart + iVar5;
    this_00->_largestUnusedArea = this_00->_largestUnusedArea - iVar5;
    uVar7 = (ulong)(uVar11 & 1);
LAB_0011b463:
    uVar3 = local_88;
    impl->allocationCount = impl->allocationCount + 1;
    JitAllocatorBlock::markAllocatedArea(this_00,(uint32_t)uVar7,(uint32_t)uVar7 + iVar5);
    uVar7 = (ulong)pJVar13->granularity * (uVar7 & 0xffffffff);
    uVar8 = this_00->_blockSize - uVar3;
    if (uVar8 <= uVar7 && uVar7 - uVar8 != 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/jitallocator.cpp"
                 ,0x380,"offset <= block->blockSize() - size");
    }
    local_68->_rx = (void *)((long)(this_00->_mapping).rx + uVar7);
    local_68->_rw = (void *)(uVar7 + (long)(this_00->_mapping).rw);
    local_68->_size = uVar3;
    local_68->_block = this_00;
    EVar2 = 0;
  }
LAB_0011b4b0:
  pthread_mutex_unlock(local_60);
  return EVar2;
}

Assistant:

Error JitAllocator::alloc(Span& out, size_t size) noexcept {
  out = Span{};

  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  constexpr uint32_t kNoIndex = std::numeric_limits<uint32_t>::max();

  // Align to the minimum granularity by default.
  size = Support::alignUp<size_t>(size, impl->granularity);
  if (ASMJIT_UNLIKELY(size == 0))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(size > std::numeric_limits<uint32_t>::max() / 2))
    return DebugUtils::errored(kErrorTooLarge);

  LockGuard guard(impl->lock);
  JitAllocatorPool* pool = &impl->pools[JitAllocatorImpl_sizeToPoolId(impl, size)];

  uint32_t areaIndex = kNoIndex;
  uint32_t areaSize = uint32_t(pool->areaSizeFromByteSize(size));

  // Try to find the requested memory area in existing blocks.
  JitAllocatorBlock* block = pool->blocks.first();
  if (block) {
    JitAllocatorBlock* initial = block;
    do {
      JitAllocatorBlock* next = block->hasNext() ? block->next() : pool->blocks.first();
      if (block->areaAvailable() >= areaSize) {
        if (block->isDirty() || block->largestUnusedArea() >= areaSize) {
          BitVectorRangeIterator<Support::BitWord, 0> it(block->_usedBitVector, pool->bitWordCountFromAreaSize(block->areaSize()), block->_searchStart, block->_searchEnd);

          size_t rangeStart = 0;
          size_t rangeEnd = block->areaSize();

          size_t searchStart = SIZE_MAX;
          size_t largestArea = 0;

          while (it.nextRange(&rangeStart, &rangeEnd, areaSize)) {
            size_t rangeSize = rangeEnd - rangeStart;
            if (rangeSize >= areaSize) {
              areaIndex = uint32_t(rangeStart);
              break;
            }

            searchStart = Support::min(searchStart, rangeStart);
            largestArea = Support::max(largestArea, rangeSize);
          }

          if (areaIndex != kNoIndex)
            break;

          if (searchStart != SIZE_MAX) {
            // Because we have iterated over the entire block, we can now mark the
            // largest unused area that can be used to cache the next traversal.
            size_t searchEnd = rangeEnd;

            block->_searchStart = uint32_t(searchStart);
            block->_searchEnd = uint32_t(searchEnd);
            block->_largestUnusedArea = uint32_t(largestArea);
            block->clearFlags(JitAllocatorBlock::kFlagDirty);
          }
        }
      }

      block = next;
    } while (block != initial);
  }

  // Allocate a new block if there is no region of a required size.
  if (areaIndex == kNoIndex) {
    size_t blockSize = JitAllocatorImpl_calculateIdealBlockSize(impl, pool, size);
    if (ASMJIT_UNLIKELY(!blockSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    ASMJIT_PROPAGATE(JitAllocatorImpl_newBlock(impl, &block, pool, blockSize));
    areaIndex = block->initialAreaStart();

    JitAllocatorImpl_insertBlock(impl, block);
    block->_searchStart += areaSize;
    block->_largestUnusedArea -= areaSize;
  }
  else if (block->hasFlag(JitAllocatorBlock::kFlagEmpty)) {
    pool->emptyBlockCount--;
    block->clearFlags(JitAllocatorBlock::kFlagEmpty);
  }

  // Update statistics.
  impl->allocationCount++;
  block->markAllocatedArea(areaIndex, areaIndex + areaSize);

  // Return a span referencing the allocated memory.
  size_t offset = pool->byteSizeFromAreaSize(areaIndex);
  ASMJIT_ASSERT(offset <= block->blockSize() - size);

  out._rx = block->rxPtr() + offset;
  out._rw = block->rwPtr() + offset;
  out._size = size;
  out._block = static_cast<void*>(block);

  return kErrorOk;
}